

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O1

char * Scl_LibertyReadCellArea(Scl_Tree_t *p,Scl_Item_t *pCell)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  Scl_Item_t *pSVar6;
  
  uVar1 = pCell->Child;
  iVar2 = p->nItems;
  if ((int)uVar1 < iVar2) {
    if ((int)uVar1 < 0) {
      pSVar6 = (Scl_Item_t *)0x0;
    }
    else {
      pSVar6 = p->pItems + uVar1;
    }
    if (pSVar6 != (Scl_Item_t *)0x0) {
      pcVar5 = p->pContents;
      do {
        iVar4 = (pSVar6->Key).Beg;
        iVar3 = (pSVar6->Key).End - iVar4;
        iVar4 = strncmp(pcVar5 + iVar4,"area",(long)iVar3);
        if (iVar3 == 4 && iVar4 == 0) {
          pcVar5 = Scl_LibertyReadString(p,pSVar6->Head);
          return pcVar5;
        }
        uVar1 = pSVar6->Next;
        if (iVar2 <= (int)uVar1) goto LAB_003cf1d3;
        if ((int)uVar1 < 0) {
          pSVar6 = (Scl_Item_t *)0x0;
        }
        else {
          pSVar6 = p->pItems + uVar1;
        }
      } while (pSVar6 != (Scl_Item_t *)0x0);
    }
    return (char *)0x0;
  }
LAB_003cf1d3:
  __assert_fail("v < p->nItems",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                ,0x4c,"Scl_Item_t *Scl_LibertyItem(Scl_Tree_t *, int)");
}

Assistant:

char * Scl_LibertyReadCellArea( Scl_Tree_t * p, Scl_Item_t * pCell )
{
    Scl_Item_t * pArea;
    Scl_ItemForEachChildName( p, pCell, pArea, "area" )
        return Scl_LibertyReadString(p, pArea->Head);
    return 0;
}